

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sphere.cpp
# Opt level: O2

HydroProp * __thiscall OpenMD::Sphere::getHydroProp(Sphere *this,RealType viscosity)

{
  HydroProp *this_00;
  double dVar1;
  double dVar2;
  Mat6x6d Xi;
  string local_290 [32];
  Vector<double,_3U> local_270;
  RectMatrix<double,_6U,_6U> local_258;
  RectMatrix<double,_6U,_6U> local_138;
  
  dVar2 = viscosity * 18.84955592153876 * this->radius_;
  dVar1 = pow(this->radius_,3.0);
  dVar1 = dVar1 * viscosity * 25.132741228718345;
  SquareMatrix<double,_6>::SquareMatrix((SquareMatrix<double,_6> *)&local_258);
  local_258.data_[0][0] = dVar2;
  local_258.data_[1][1] = dVar2;
  local_258.data_[2][2] = dVar2;
  local_258.data_[3][3] = dVar1;
  local_258.data_[4][4] = dVar1;
  local_258.data_[5][5] = dVar1;
  RectMatrix<double,_6U,_6U>::mul(&local_258,14393.26479);
  this_00 = (HydroProp *)operator_new(0x280);
  Vector<double,_3U>::Vector(&local_270,(Vector<double,_3U> *)OpenMD::V3Zero);
  RectMatrix<double,_6U,_6U>::operator=(&local_138,&local_258);
  HydroProp::HydroProp(this_00,(Vector3d *)&local_270,(Mat6x6d *)&local_138);
  std::__cxx11::string::string(local_290,(string *)&(this->super_Shape).name_);
  std::__cxx11::string::_M_assign((string *)this_00);
  std::__cxx11::string::~string(local_290);
  return this_00;
}

Assistant:

HydroProp* Sphere::getHydroProp(RealType viscosity) {
    RealType Xitt = 6.0 * Constants::PI * viscosity * radius_;
    RealType Xirr = 8.0 * Constants::PI * viscosity * pow(radius_, 3);

    Mat6x6d Xi;

    Xi(0, 0) = Xitt;
    Xi(1, 1) = Xitt;
    Xi(2, 2) = Xitt;
    Xi(3, 3) = Xirr;
    Xi(4, 4) = Xirr;
    Xi(5, 5) = Xirr;

    Xi *= Constants::viscoConvert;

    HydroProp* hprop = new HydroProp(V3Zero, Xi);
    hprop->setName(getName());
    return hprop;
  }